

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.h
# Opt level: O0

void bandit::use_default_reporters(choice_options *choices)

{
  option_map *poVar1;
  anon_class_1_0_00000001 local_1f9;
  controller_func_t local_1f8;
  allocator local_1d1;
  string local_1d0;
  anon_class_1_0_00000001 local_1a9;
  controller_func_t local_1a8;
  allocator local_181;
  string local_180;
  anon_class_1_0_00000001 local_159;
  controller_func_t local_158;
  allocator local_131;
  string local_130;
  anon_class_1_0_00000001 local_109;
  controller_func_t local_108;
  allocator local_e1;
  string local_e0;
  anon_class_1_0_00000001 local_b9;
  controller_func_t local_b8;
  allocator local_91;
  string local_90;
  anon_class_1_0_00000001 local_69;
  controller_func_t local_68;
  allocator local_31;
  string local_30;
  choice_options *local_10;
  choice_options *choices_local;
  
  local_10 = choices;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"singleline",&local_31);
  std::function<void(bandit::detail::controller_t&)>::
  function<bandit::use_default_reporters(bandit::detail::choice_options&)::_lambda(bandit::detail::controller_t&)_1_,void>
            ((function<void(bandit::detail::controller_t&)> *)&local_68,&local_69);
  detail::option_map::add(&choices->reporters,&local_30,&local_68,false);
  std::function<void_(bandit::detail::controller_t_&)>::~function(&local_68);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  poVar1 = &local_10->reporters;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"xunit",&local_91);
  std::function<void(bandit::detail::controller_t&)>::
  function<bandit::use_default_reporters(bandit::detail::choice_options&)::_lambda(bandit::detail::controller_t&)_2_,void>
            ((function<void(bandit::detail::controller_t&)> *)&local_b8,&local_b9);
  detail::option_map::add(poVar1,&local_90,&local_b8,false);
  std::function<void_(bandit::detail::controller_t_&)>::~function(&local_b8);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  poVar1 = &local_10->reporters;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"info",&local_e1);
  std::function<void(bandit::detail::controller_t&)>::
  function<bandit::use_default_reporters(bandit::detail::choice_options&)::_lambda(bandit::detail::controller_t&)_3_,void>
            ((function<void(bandit::detail::controller_t&)> *)&local_108,&local_109);
  detail::option_map::add(poVar1,&local_e0,&local_108,false);
  std::function<void_(bandit::detail::controller_t_&)>::~function(&local_108);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  poVar1 = &local_10->reporters;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"spec",&local_131);
  std::function<void(bandit::detail::controller_t&)>::
  function<bandit::use_default_reporters(bandit::detail::choice_options&)::_lambda(bandit::detail::controller_t&)_4_,void>
            ((function<void(bandit::detail::controller_t&)> *)&local_158,&local_159);
  detail::option_map::add(poVar1,&local_130,&local_158,false);
  std::function<void_(bandit::detail::controller_t_&)>::~function(&local_158);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  poVar1 = &local_10->reporters;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"crash",&local_181);
  std::function<void(bandit::detail::controller_t&)>::
  function<bandit::use_default_reporters(bandit::detail::choice_options&)::_lambda(bandit::detail::controller_t&)_5_,void>
            ((function<void(bandit::detail::controller_t&)> *)&local_1a8,&local_1a9);
  detail::option_map::add(poVar1,&local_180,&local_1a8,false);
  std::function<void_(bandit::detail::controller_t_&)>::~function(&local_1a8);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  poVar1 = &local_10->reporters;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"dots",&local_1d1);
  std::function<void(bandit::detail::controller_t&)>::
  function<bandit::use_default_reporters(bandit::detail::choice_options&)::_lambda(bandit::detail::controller_t&)_6_,void>
            ((function<void(bandit::detail::controller_t&)> *)&local_1f8,&local_1f9);
  detail::option_map::add(poVar1,&local_1d0,&local_1f8,true);
  std::function<void_(bandit::detail::controller_t_&)>::~function(&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  return;
}

Assistant:

inline void use_default_reporters(detail::choice_options& choices) {
    choices.reporters.add("singleline", [&](detail::controller_t& controller) {
      controller.set_reporter(new bandit::reporter::singleline(controller.get_formatter(), controller.get_colorizer()));
    });
    choices.reporters.add("xunit", [&](detail::controller_t& controller) {
      controller.set_reporter(new bandit::reporter::xunit(controller.get_formatter()));
    });
    choices.reporters.add("info", [&](detail::controller_t& controller) {
      controller.set_reporter(new bandit::reporter::info(controller.get_formatter(), controller.get_colorizer()));
    });
    choices.reporters.add("spec", [&](detail::controller_t& controller) {
      controller.set_reporter(new bandit::reporter::spec(controller.get_formatter(), controller.get_colorizer()));
    });
    choices.reporters.add("crash", [&](detail::controller_t& controller) {
      controller.set_reporter(new bandit::reporter::crash(controller.get_formatter()));
    });
    choices.reporters.add("dots", [&](detail::controller_t& controller) {
      controller.set_reporter(new bandit::reporter::dots(controller.get_formatter(), controller.get_colorizer()));
    }, true);
  }